

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void setup_block_rdmult(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,
                       AQ_MODE aq_mode,MB_MODE_INFO *mbmi)

{
  int iVar1;
  long in_RSI;
  MACROBLOCK *in_RDI;
  byte in_R8B;
  char in_R9B;
  AV1_COMP *unaff_retaddr;
  long in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000024;
  int energy;
  int in_stack_00000058;
  BLOCK_SIZE in_stack_0000005f;
  MACROBLOCK *in_stack_00000060;
  AV1_COMP *in_stack_00000068;
  undefined4 local_3c;
  byte local_38;
  
  *(undefined4 *)(in_RSI + 0x4218) = *(undefined4 *)((long)in_RDI[2].sb_enc.tpl_intra_cost + 0xe4);
  if (in_R9B != '\0') {
    if (in_R9B == '\x01') {
      if (in_RDI[3].coeff_costs.coeff_costs[2][1].lps_cost[0xd][2] != 0) {
        if (in_R8B < 7) {
          local_38 = (byte)*(undefined4 *)(in_RSI + 0x4228);
        }
        else {
          iVar1 = av1_log_block_var(unaff_retaddr,in_RDI,(BLOCK_SIZE)((ulong)in_RSI >> 0x38));
          local_38 = (byte)iVar1;
        }
        *(ushort *)(in_stack_00000008 + 0xa7) =
             *(ushort *)(in_stack_00000008 + 0xa7) & 0xfff8 | local_38 & 7;
      }
      iVar1 = set_rdmult((AV1_COMP *)CONCAT44(mi_row,mi_col),
                         (MACROBLOCK *)CONCAT17(bsize,CONCAT16(aq_mode,_energy)),in_stack_00000024);
      *(int *)(in_RSI + 0x4218) = iVar1;
    }
    else if (in_R9B == '\x02') {
      iVar1 = set_rdmult((AV1_COMP *)CONCAT44(mi_row,mi_col),
                         (MACROBLOCK *)CONCAT17(bsize,CONCAT16(aq_mode,_energy)),in_stack_00000024);
      *(int *)(in_RSI + 0x4218) = iVar1;
    }
    else if ((in_R9B == '\x03') &&
            (iVar1 = cyclic_refresh_segment_id_boosted
                               ((uint)((byte)*(undefined2 *)(in_stack_00000008 + 0xa7) & 7)),
            iVar1 != 0)) {
      iVar1 = av1_cyclic_refresh_get_rdmult
                        ((CYCLIC_REFRESH *)in_RDI[3].e_mbd.plane[1].seg_iqmatrix[3][8]);
      *(int *)(in_RSI + 0x4218) = iVar1;
    }
  }
  if ((*(int *)&in_RDI[1].comp_rd_stats[2].interinter_comp.seg_mask != 0) &&
     (in_RDI[2].warp_sample_info[2].pts_inref[9] == 0)) {
    iVar1 = av1_get_cb_rdmult(in_stack_00000068,in_stack_00000060,in_stack_0000005f,
                              in_stack_00000058,mbmi._4_4_);
    *(int *)(in_RSI + 0x4218) = iVar1;
  }
  if (((in_RDI[1].comp_rd_stats[0xf].model_rate[2] == 1) ||
      (in_RDI[1].comp_rd_stats[0xf].model_rate[2] == 10)) ||
     (in_RDI[1].comp_rd_stats[0xf].model_rate[2] == 0xb)) {
    av1_set_ssim_rdmult((AV1_COMP *)CONCAT44(mi_row,mi_col),
                        (int *)CONCAT17(bsize,CONCAT16(aq_mode,_energy)),in_stack_00000024._3_1_,
                        in_stack_00000020,in_stack_0000001c,in_stack_00000010);
  }
  if (*(char *)in_RDI[1].comp_rd_stats[0x10].mv == '\x02') {
    *(int *)(in_RSI + 0x4218) =
         (int)((long)*(int *)(in_RSI + 0x4218) * (long)*(int *)(in_RSI + 0x421c) >> 7);
  }
  if (*(int *)(in_RSI + 0x4218) < 1) {
    local_3c = 1;
  }
  else {
    local_3c = *(undefined4 *)(in_RSI + 0x4218);
  }
  *(undefined4 *)(in_RSI + 0x4218) = local_3c;
  return;
}

Assistant:

static void setup_block_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                               int mi_row, int mi_col, BLOCK_SIZE bsize,
                               AQ_MODE aq_mode, MB_MODE_INFO *mbmi) {
  x->rdmult = cpi->rd.RDMULT;

  if (aq_mode != NO_AQ) {
    assert(mbmi != NULL);
    if (aq_mode == VARIANCE_AQ) {
      if (cpi->vaq_refresh) {
        const int energy = bsize <= BLOCK_16X16
                               ? x->mb_energy
                               : av1_log_block_var(cpi, x, bsize);
        mbmi->segment_id = energy;
      }
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == COMPLEXITY_AQ) {
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == CYCLIC_REFRESH_AQ) {
      // If segment is boosted, use rdmult for that segment.
      if (cyclic_refresh_segment_id_boosted(mbmi->segment_id))
        x->rdmult = av1_cyclic_refresh_get_rdmult(cpi->cyclic_refresh);
    }
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->common.delta_q_info.delta_q_present_flag &&
      !cpi->sf.rt_sf.use_nonrd_pick_mode) {
    x->rdmult = av1_get_cb_rdmult(cpi, x, bsize, mi_row, mi_col);
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2) {
    av1_set_ssim_rdmult(cpi, &x->errorperbit, bsize, mi_row, mi_col,
                        &x->rdmult);
  }
#if CONFIG_SALIENCY_MAP
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_SALIENCY_MAP) {
    av1_set_saliency_map_vmaf_rdmult(cpi, &x->errorperbit,
                                     cpi->common.seq_params->sb_size, mi_row,
                                     mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_VMAF
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_WITHOUT_PREPROCESSING ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    av1_set_vmaf_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_BUTTERAUGLI
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
    av1_set_butteraugli_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
  if (cpi->oxcf.mode == ALLINTRA) {
    x->rdmult = (int)(((int64_t)x->rdmult * x->intra_sb_rdmult_modifier) >> 7);
  }

  // Check to make sure that the adjustments above have not caused the
  // rd multiplier to be truncated to 0.
  x->rdmult = (x->rdmult > 0) ? x->rdmult : 1;
}